

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O3

void __thiscall
Assimp::Q3BSPFileImporter::createMaterialMap(Q3BSPFileImporter *this,Q3BSPModel *pModel)

{
  int iVar1;
  int iVar2;
  iterator __position;
  pointer ppsVar3;
  ostream *this_00;
  iterator iVar4;
  vector<Assimp::Q3BSP::sQ3BSPFace*,std::allocator<Assimp::Q3BSP::sQ3BSPFace*>> *this_01;
  mapped_type *ppvVar5;
  ulong uVar6;
  string key;
  sQ3BSPFace *pQ3BSPFace;
  ostringstream str;
  key_type local_1f8;
  sQ3BSPFace *local_1d8;
  _Base_ptr local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
  ppsVar3 = (pModel->m_Faces).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pModel->m_Faces).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppsVar3) {
    local_1d0 = &(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    uVar6 = 0;
    do {
      local_1d8 = ppsVar3[uVar6];
      iVar1 = local_1d8->iTextureID;
      iVar2 = local_1d8->iLightmapID;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      this_00 = (ostream *)std::ostream::operator<<(local_1a8,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,".",1);
      std::ostream::operator<<(this_00,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1c8);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
              ::find(&(this->m_MaterialLookupMap)._M_t,&local_1f8);
      if (local_1d0 == iVar4._M_node) {
        this_01 = (vector<Assimp::Q3BSP::sQ3BSPFace*,std::allocator<Assimp::Q3BSP::sQ3BSPFace*>> *)
                  operator_new(0x18);
        *(undefined8 *)this_01 = 0;
        *(pointer *)(this_01 + 8) = (pointer)0x0;
        *(pointer *)(this_01 + 0x10) = (pointer)0x0;
        ppvVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
                  ::operator[](&this->m_MaterialLookupMap,&local_1f8);
        *ppvVar5 = (mapped_type)this_01;
      }
      else {
        this_01 = *(vector<Assimp::Q3BSP::sQ3BSPFace*,std::allocator<Assimp::Q3BSP::sQ3BSPFace*>> **
                   )(iVar4._M_node + 2);
        if (this_01 ==
            (vector<Assimp::Q3BSP::sQ3BSPFace*,std::allocator<Assimp::Q3BSP::sQ3BSPFace*>> *)0x0) {
          __assert_fail("nullptr != pCurFaceArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                        ,0x220,
                        "void Assimp::Q3BSPFileImporter::createMaterialMap(const Q3BSP::Q3BSPModel *)"
                       );
        }
      }
      __position._M_current = *(sQ3BSPFace ***)(this_01 + 8);
      if (__position._M_current == *(sQ3BSPFace ***)(this_01 + 0x10)) {
        std::vector<Assimp::Q3BSP::sQ3BSPFace*,std::allocator<Assimp::Q3BSP::sQ3BSPFace*>>::
        _M_realloc_insert<Assimp::Q3BSP::sQ3BSPFace*const&>(this_01,__position,&local_1d8);
      }
      else {
        *__position._M_current = local_1d8;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
      }
      uVar6 = uVar6 + 1;
      ppsVar3 = (pModel->m_Faces).
                super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(pModel->m_Faces).
                                   super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar3 >> 3))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Q3BSPFileImporter::createMaterialMap( const Q3BSP::Q3BSPModel *pModel ) {
    std::string key( "" );
    std::vector<sQ3BSPFace*> *pCurFaceArray = NULL;
    for ( size_t idx = 0; idx < pModel->m_Faces.size(); idx++ )
    {
        Q3BSP::sQ3BSPFace *pQ3BSPFace = pModel->m_Faces[ idx ];
        const int texId = pQ3BSPFace->iTextureID;
        const int lightMapId = pQ3BSPFace->iLightmapID;
        createKey( texId, lightMapId, key );
        FaceMapIt it = m_MaterialLookupMap.find( key );
        if ( m_MaterialLookupMap.end() == it ) {
            pCurFaceArray = new std::vector<Q3BSP::sQ3BSPFace*>;
            m_MaterialLookupMap[ key ] = pCurFaceArray;
        }
        else
        {
            pCurFaceArray = (*it).second;
        }
        ai_assert( nullptr != pCurFaceArray );
        if (nullptr != pCurFaceArray )
        {
            pCurFaceArray->push_back( pQ3BSPFace );
        }
    }
}